

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NetDeclarationSyntax::setChild
          (NetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  NetStrengthSyntax *pNVar3;
  TimingControlSyntax *pTVar4;
  SyntaxNode *pSVar5;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar6;
  logic_error *this_00;
  Token TVar7;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 8) {
    switch(index) {
    case 0:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar5);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->netType).kind = TVar7.kind;
      (this->netType).field_0x2 = TVar7._2_1_;
      (this->netType).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->netType).rawLen = TVar7.rawLen;
      (this->netType).info = TVar7.info;
      break;
    case 2:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pNVar3 = (NetStrengthSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pNVar3 = SyntaxNode::as<slang::syntax::NetStrengthSyntax>(pSVar5);
      }
      this->strength = pNVar3;
      break;
    case 3:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->expansionHint).kind = TVar7.kind;
      (this->expansionHint).field_0x2 = TVar7._2_1_;
      (this->expansionHint).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->expansionHint).rawLen = TVar7.rawLen;
      (this->expansionHint).info = TVar7.info;
      break;
    case 4:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar5);
      }
      not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
                ((not_null<slang::syntax::DataTypeSyntax*> *)&local_b8,(DataTypeSyntax **)&local_d8)
      ;
      (this->type).ptr = (DataTypeSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 5:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pTVar4 = (TimingControlSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pTVar4 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar5);
      }
      this->delay = pTVar4;
      break;
    case 6:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar6 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>>
                         (pSVar5);
      (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->declarators).super_SyntaxListBase.childCount =
           (pSVar6->super_SyntaxListBase).childCount;
      sVar1 = (pSVar6->elements).size_;
      (this->declarators).elements.data_ = (pSVar6->elements).data_;
      (this->declarators).elements.size_ = sVar1;
      break;
    case 7:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar7.kind;
      (this->semi).field_0x2 = TVar7._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->semi).rawLen = TVar7.rawLen;
      (this->semi).info = TVar7.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x22c9);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void NetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: netType = child.token(); return;
        case 2: strength = child.node() ? &child.node()->as<NetStrengthSyntax>() : nullptr; return;
        case 3: expansionHint = child.token(); return;
        case 4: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 5: delay = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 6: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}